

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O3

void __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *source,size_t length)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CrtAllocator *pCVar5;
  size_t sVar6;
  Token *pTVar7;
  Token *pTVar8;
  SizeType SVar9;
  Ch *pCVar10;
  Ch *pCVar11;
  size_t __size;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  char c;
  size_t sVar15;
  Token *pTVar16;
  PercentDecodeStream is;
  PercentDecodeStream local_68;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_48;
  
  if (source == (Ch *)0x0) {
    __assert_fail("source != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a3,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->nameBuffer_ != (Ch *)0x0) {
    __assert_fail("nameBuffer_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a4,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->tokens_ != (Token *)0x0) {
    __assert_fail("tokens_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a5,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->allocator_ == (CrtAllocator *)0x0) {
    pCVar5 = (CrtAllocator *)operator_new(1);
    this->allocator_ = pCVar5;
    this->ownAllocator_ = pCVar5;
  }
  this->tokenCount_ = 0;
  if (length == 0) {
    sVar15 = 0;
  }
  else {
    sVar6 = 0;
    sVar15 = 0;
    do {
      if (source[sVar6] == '/') {
        sVar15 = sVar15 + 1;
        this->tokenCount_ = sVar15;
      }
      sVar6 = sVar6 + 1;
    } while (length != sVar6);
  }
  __size = sVar15 * 0x10 + length;
  if (__size == 0) {
    pTVar7 = (Token *)0x0;
  }
  else {
    pTVar7 = (Token *)malloc(__size);
  }
  this->tokens_ = pTVar7;
  pTVar8 = pTVar7 + sVar15;
  this->nameBuffer_ = (Ch *)pTVar8;
  cVar1 = *source;
  pCVar10 = (Ch *)(ulong)(cVar1 == '#');
  if ((pCVar10 == (Ch *)length) || (source[(long)pCVar10] == '/')) {
    pTVar16 = pTVar8;
    if (pCVar10 < length) {
      do {
        if (source[(long)pCVar10] != '/') {
          __assert_fail("source[i] == \'/\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                        ,0x3c2,
                        "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                       );
        }
        pCVar10 = pCVar10 + 1;
        pTVar7->name = (Ch *)pTVar16;
        bVar2 = true;
        if (pCVar10 < length) {
          bVar2 = true;
          do {
            c = source[(long)pCVar10];
            if (c == '/') break;
            pCVar11 = pCVar10;
            if (cVar1 == '#') {
              if (c != '%') {
                bVar3 = NeedPercentEncode(this,c);
                if (!bVar3) goto LAB_001415c4;
                this->parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
                goto LAB_00141729;
              }
              local_68.src_ = source + (long)pCVar10;
              local_68.valid_ = true;
              local_68.head_ = local_68.src_;
              local_68.end_ = source + length;
              local_48.src_ = (Ch *)pTVar16;
              local_48.dst_ = (Ch *)pTVar16;
              local_48.head_ = (Ch *)pTVar16;
              bVar3 = UTF8<char>::
                      Validate<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentDecodeStream,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                                (&local_68,&local_48);
              if ((!bVar3) || (local_68.valid_ == false)) {
                this->parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
                goto LAB_00141729;
              }
              if ((long)local_48.dst_ - (long)pTVar16 == 1) {
                c = *(char *)&pTVar16->name;
                pCVar11 = local_68.src_ + (long)(pCVar10 + (-1 - (long)local_68.head_));
                goto LAB_001415c4;
              }
              pTVar16 = (Token *)((long)pTVar16 + ((long)local_48.dst_ - (long)pTVar16));
              pCVar10 = local_68.src_ + ((long)pCVar10 - (long)local_68.head_);
              bVar2 = false;
            }
            else {
LAB_001415c4:
              pCVar10 = pCVar11 + 1;
              if (c == '~') {
                if (length <= pCVar10) {
LAB_001416fe:
                  this->parseErrorCode_ = kPointerParseErrorInvalidEscape;
                  goto LAB_00141729;
                }
                c = '~';
                if (source[(long)pCVar10] != '0') {
                  if (source[(long)pCVar10] != '1') goto LAB_001416fe;
                  c = '/';
                }
                pCVar10 = pCVar11 + 2;
              }
              if ((byte)(c - 0x3aU) < 0xf6) {
                bVar2 = false;
              }
              *(char *)&pTVar16->name = c;
              pTVar16 = (Token *)((long)&pTVar16->name + 1);
            }
          } while (pCVar10 < length);
          iVar4 = (int)pTVar7->name;
        }
        else {
          iVar4 = (int)pTVar16;
        }
        SVar9 = (int)pTVar16 - iVar4;
        pTVar7->length = SVar9;
        if (SVar9 == 0) {
          bVar2 = false;
        }
        *(Ch *)&pTVar16->name = '\0';
        if (((bVar2) && (1 < pTVar7->length)) && (*pTVar7->name == '0')) {
          bVar2 = false;
        }
        SVar9 = 0xffffffff;
        if (bVar2) {
          if ((ulong)pTVar7->length == 0) {
            SVar9 = 0;
          }
          else {
            uVar12 = 0;
            uVar13 = 0;
            do {
              uVar14 = ((int)pTVar7->name[uVar12] + uVar13 * 10) - 0x30;
              SVar9 = 0xffffffff;
              if (uVar14 < uVar13) goto LAB_001416b5;
              uVar12 = uVar12 + 1;
              uVar13 = uVar14;
            } while (pTVar7->length != uVar12);
            SVar9 = uVar14;
            if (!bVar2) {
              SVar9 = 0xffffffff;
            }
          }
        }
LAB_001416b5:
        pTVar16 = (Token *)((long)&pTVar16->name + 1);
        pTVar7->index = SVar9;
        pTVar7 = pTVar7 + 1;
      } while (pCVar10 < length);
      pTVar8 = (Token *)this->nameBuffer_;
    }
    if ((Token *)((long)&pTVar8->name + length) < pTVar16) {
      __assert_fail("name <= nameBuffer_ + length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                    ,0x419,
                    "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    this->parseErrorCode_ = kPointerParseErrorNone;
  }
  else {
    this->parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
LAB_00141729:
    free(this->tokens_);
    this->nameBuffer_ = (Ch *)0x0;
    this->tokens_ = (Token *)0x0;
    this->tokenCount_ = 0;
    this->parseErrorOffset_ = (size_t)pCVar10;
  }
  return;
}

Assistant:

void Parse(const Ch* source, size_t length) {
        RAPIDJSON_ASSERT(source != NULL);
        RAPIDJSON_ASSERT(nameBuffer_ == 0);
        RAPIDJSON_ASSERT(tokens_ == 0);

        // Create own allocator if user did not supply.
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();

        // Count number of '/' as tokenCount
        tokenCount_ = 0;
        for (const Ch* s = source; s != source + length; s++) 
            if (*s == '/')
                tokenCount_++;

        Token* token = tokens_ = static_cast<Token *>(allocator_->Malloc(tokenCount_ * sizeof(Token) + length * sizeof(Ch)));
        Ch* name = nameBuffer_ = reinterpret_cast<Ch *>(tokens_ + tokenCount_);
        size_t i = 0;

        // Detect if it is a URI fragment
        bool uriFragment = false;
        if (source[i] == '#') {
            uriFragment = true;
            i++;
        }

        if (i != length && source[i] != '/') {
            parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
            goto error;
        }

        while (i < length) {
            RAPIDJSON_ASSERT(source[i] == '/');
            i++; // consumes '/'

            token->name = name;
            bool isNumber = true;

            while (i < length && source[i] != '/') {
                Ch c = source[i];
                if (uriFragment) {
                    // Decoding percent-encoding for URI fragment
                    if (c == '%') {
                        PercentDecodeStream is(&source[i], source + length);
                        GenericInsituStringStream<EncodingType> os(name);
                        Ch* begin = os.PutBegin();
                        if (!Transcoder<UTF8<>, EncodingType>().Validate(is, os) || !is.IsValid()) {
                            parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
                            goto error;
                        }
                        size_t len = os.PutEnd(begin);
                        i += is.Tell() - 1;
                        if (len == 1)
                            c = *name;
                        else {
                            name += len;
                            isNumber = false;
                            i++;
                            continue;
                        }
                    }
                    else if (NeedPercentEncode(c)) {
                        parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
                        goto error;
                    }
                }

                i++;

                // Escaping "~0" -> '~', "~1" -> '/'
                if (c == '~') {
                    if (i < length) {
                        c = source[i];
                        if (c == '0')       c = '~';
                        else if (c == '1')  c = '/';
                        else {
                            parseErrorCode_ = kPointerParseErrorInvalidEscape;
                            goto error;
                        }
                        i++;
                    }
                    else {
                        parseErrorCode_ = kPointerParseErrorInvalidEscape;
                        goto error;
                    }
                }

                // First check for index: all of characters are digit
                if (c < '0' || c > '9')
                    isNumber = false;

                *name++ = c;
            }
            token->length = static_cast<SizeType>(name - token->name);
            if (token->length == 0)
                isNumber = false;
            *name++ = '\0'; // Null terminator

            // Second check for index: more than one digit cannot have leading zero
            if (isNumber && token->length > 1 && token->name[0] == '0')
                isNumber = false;

            // String to SizeType conversion
            SizeType n = 0;
            if (isNumber) {
                for (size_t j = 0; j < token->length; j++) {
                    SizeType m = n * 10 + static_cast<SizeType>(token->name[j] - '0');
                    if (m < n) {   // overflow detection
                        isNumber = false;
                        break;
                    }
                    n = m;
                }
            }

            token->index = isNumber ? n : kPointerInvalidIndex;
            token++;
        }

        RAPIDJSON_ASSERT(name <= nameBuffer_ + length); // Should not overflow buffer
        parseErrorCode_ = kPointerParseErrorNone;
        return;

    error:
        Allocator::Free(tokens_);
        nameBuffer_ = 0;
        tokens_ = 0;
        tokenCount_ = 0;
        parseErrorOffset_ = i;
        return;
    }